

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random.h
# Opt level: O1

FeatureOptions<wasm::UnaryOp> * __thiscall
wasm::Random::FeatureOptions<wasm::UnaryOp>::
add<wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp>
          (FeatureOptions<wasm::UnaryOp> *this,FeatureSet feature,UnaryOp option,UnaryOp rest,
          UnaryOp rest_1,UnaryOp rest_2,UnaryOp rest_3,UnaryOp rest_4,UnaryOp rest_5)

{
  iterator __position;
  vector<wasm::UnaryOp,std::allocator<wasm::UnaryOp>> *this_00;
  FeatureOptions<wasm::UnaryOp> *pFVar1;
  key_type local_38;
  UnaryOp local_34;
  FeatureSet feature_local;
  UnaryOp option_local;
  
  local_38.features = feature.features;
  local_34 = option;
  this_00 = (vector<wasm::UnaryOp,std::allocator<wasm::UnaryOp>> *)
            std::
            map<wasm::FeatureSet,_std::vector<wasm::UnaryOp,_std::allocator<wasm::UnaryOp>_>,_std::less<wasm::FeatureSet>,_std::allocator<std::pair<const_wasm::FeatureSet,_std::vector<wasm::UnaryOp,_std::allocator<wasm::UnaryOp>_>_>_>_>
            ::operator[](&this->options,&local_38);
  __position._M_current = *(UnaryOp **)(this_00 + 8);
  if (__position._M_current == *(UnaryOp **)(this_00 + 0x10)) {
    std::vector<wasm::UnaryOp,std::allocator<wasm::UnaryOp>>::
    _M_realloc_insert<wasm::UnaryOp_const&>(this_00,__position,&local_34);
  }
  else {
    *__position._M_current = local_34;
    *(UnaryOp **)(this_00 + 8) = __position._M_current + 1;
  }
  pFVar1 = add<wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp>
                     (this,(FeatureSet)local_38.features,rest,rest_1,rest_2,rest_3,rest_4,rest_5);
  return pFVar1;
}

Assistant:

FeatureOptions<T>& add(FeatureSet feature, T option, Ts... rest) {
      options[feature].push_back(option);
      return add(feature, rest...);
    }